

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O2

void __thiscall
boost::unordered::detail::foa::
table_core<boost::unordered::detail::foa::flat_map_types<std::filesystem::__cxx11::path,_unsigned_long>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::filesystem::__cxx11::path,_void>,_std::equal_to<std::filesystem::__cxx11::path>,_std::allocator<std::pair<const_std::filesystem::__cxx11::path,_unsigned_long>_>_>
::~table_core(table_core<boost::unordered::detail::foa::flat_map_types<std::filesystem::__cxx11::path,_unsigned_long>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::filesystem::__cxx11::path,_void>,_std::equal_to<std::filesystem::__cxx11::path>,_std::allocator<std::pair<const_std::filesystem::__cxx11::path,_unsigned_long>_>_>
              *this)

{
  table_core<boost::unordered::detail::foa::flat_map_types<std::filesystem::__cxx11::path,unsigned_long>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::filesystem::__cxx11::path,void>,std::equal_to<std::filesystem::__cxx11::path>,std::allocator<std::pair<std::filesystem::__cxx11::path_const,unsigned_long>>>
  ::
  for_all_elements<boost::unordered::detail::foa::table_core<boost::unordered::detail::foa::flat_map_types<std::filesystem::__cxx11::path,unsigned_long>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::filesystem::__cxx11::path,void>,std::equal_to<std::filesystem::__cxx11::path>,std::allocator<std::pair<std::filesystem::__cxx11::path_const,unsigned_long>>>::~for_all_elements()::_lambda(std::pair<std::filesystem::__cxx11::path_const,unsigned_long>*)_1_>
            (&this->arrays,(anon_class_8_1_8991fb9c)this);
  delete_arrays(this,&this->arrays);
  return;
}

Assistant:

~table_core() noexcept {
        for_all_elements([this](element_type* p) { destroy_element(p); });
        delete_arrays(arrays);
    }